

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent.cpp
# Opt level: O3

double ear::anon_unknown_0::extentMod(double extent,double distance)

{
  double dVar1;
  double dVar2;
  Matrix<double,_3,_1,_0,_3,_1> local_48;
  Matrix<double,_3,_1,_0,_3,_1> local_28;
  
  local_28.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       360.0;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.2;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       1.0;
  dVar1 = interp<2,_2>(extent,(Matrix<double,_2,_1,_0,_2,_1> *)&local_28,
                       (Matrix<double,_2,_1,_0,_2,_1> *)&local_48);
  dVar2 = atan2(dVar1,1.0);
  dVar1 = atan2(dVar1,distance);
  local_28.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       360.0;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       360.0;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       extent;
  local_28.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       dVar2 * 57.29577951308232 * 4.0;
  dVar1 = interp<3,_3>(dVar1 * 57.29577951308232 * 4.0,&local_28,&local_48);
  return dVar1;
}

Assistant:

double extentMod(double extent, double distance) {
      double minSize = 0.2;
      double size = interp(extent, Eigen::Vector2d(0.0, 360.0),
                           Eigen::Vector2d(minSize, 1.0));
      double extent1 = 4.0 * degrees(atan2(size, 1.0));
      return interp(4.0 * degrees(atan2(size, distance)),
                    Eigen::Vector3d(0.0, extent1, 360.0),
                    Eigen::Vector3d(0.0, extent, 360.0));
    }